

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Parser_TestInvalidExpression_Test::
~Parser_TestInvalidExpression_Test(Parser_TestInvalidExpression_Test *this)

{
  void *in_RDI;
  
  ~Parser_TestInvalidExpression_Test((Parser_TestInvalidExpression_Test *)0x19fb48);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Parser, TestInvalidExpression)
{
    // TODO(jsonnet-team): The error output of the following differs from the Go
    // implementation, which is:
    // test:1:1-4 Unexpected: (for, "for") while parsing terminal)
    testParseError("for", "test:1:1-4: unexpected: for while parsing terminal");
    testParseError("", "test:1:1: unexpected end of file.");
    testParseError("((a b))", R"_(test:1:5: expected token ")" but got (IDENTIFIER, "b"))_");
    testParseError("a.1", R"(test:1:3: expected token IDENTIFIER but got (NUMBER, "1"))");
    testParseError("super.1", R"(test:1:7: expected token IDENTIFIER but got (NUMBER, "1"))");
    testParseError("super[(a b)]", R"_(test:1:10: expected token ")" but got (IDENTIFIER, "b"))_");
    testParseError("super[a b]", R"(test:1:9: expected token "]" but got (IDENTIFIER, "b"))");
    testParseError("super", "test:1:1-6: expected . or [ after super.");
}